

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O2

Constraint *
create_equal_to_contents_constraint
          (void *pointer_to_compare,size_t size_to_compare,char *compared_pointer_name)

{
  CgreenValue expected_value;
  Constraint *pCVar1;
  CgreenValue local_30;
  
  make_cgreen_pointer_value(&local_30,pointer_to_compare);
  expected_value.value.integer_value = local_30.value.integer_value;
  expected_value.type = local_30.type;
  expected_value._4_4_ = local_30._4_4_;
  expected_value.value_size = local_30.value_size;
  pCVar1 = create_constraint_expecting(expected_value,compared_pointer_name);
  pCVar1->type = CGREEN_CONTENT_COMPARER_CONSTRAINT;
  pCVar1->compare = compare_want_contents;
  pCVar1->execute = test_want;
  pCVar1->name = "equal contents of";
  pCVar1->size_of_expected_value = size_to_compare;
  return pCVar1;
}

Assistant:

Constraint *create_equal_to_contents_constraint(void *pointer_to_compare, size_t size_to_compare, const char *compared_pointer_name) {
    Constraint *constraint = create_constraint_expecting(make_cgreen_pointer_value(pointer_to_compare), compared_pointer_name);
    constraint->type = CGREEN_CONTENT_COMPARER_CONSTRAINT;

    constraint->compare = &compare_want_contents;
    constraint->execute = &test_want;
    constraint->name = "equal contents of";
    constraint->size_of_expected_value = size_to_compare;

    return constraint;
}